

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterCommon.h
# Opt level: O1

int __thiscall PixelToaster::DisplayAdapter::open(DisplayAdapter *this,char *__file,int __oflag,...)

{
  ulong uVar1;
  int in_ECX;
  Enumeration in_R8D;
  Enumeration in_R9D;
  
  (*(this->super_DisplayInterface)._vptr_DisplayInterface[3])();
  uVar1 = 0;
  do {
    if (__file[uVar1] == '\0') goto LAB_0010895f;
    this->_title[uVar1] = __file[uVar1];
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xff);
  uVar1 = 0xff;
LAB_0010895f:
  this->_title[uVar1 & 0xffffffff] = '\0';
  this->_width = __oflag;
  this->_height = in_ECX;
  (this->_output).enumeration = in_R8D;
  (this->_mode).enumeration = in_R9D;
  this->_open = true;
  return (int)CONCAT71((int7)((uVar1 & 0xffffffff) >> 8),1);
}

Assistant:

bool open(const char title[], int width, int height, Output output, Mode mode) override
    {
        close();

        magical_strcpy(_title, title);
        _width  = width;
        _height = height;
        _output = output;
        _mode   = mode;
        _open   = true;

        return true;
    }